

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_109f::mndl<Imf_3_4::Rgba>
          (anon_unknown_dwarf_109f *this,Array2D<Imf_3_4::Rgba> *px,int w,int h,int xMin,int xMax,
          int yMin,int yMax,int xSamples,int ySamples,double rMin,double rMax,double iMin,
          double aspect,double rSeed,double iSeed)

{
  double dVar1;
  double dVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  long local_b0;
  
  lVar4 = _imath_half_to_float_table;
  iVar10 = 6;
  if (xSamples < 6) {
    iVar10 = xSamples;
  }
  iVar16 = 6;
  if (ySamples < 6) {
    iVar16 = ySamples;
  }
  if (yMin < yMax) {
    fVar20 = (1.0 / (float)iVar16) * (1.0 / (float)iVar10);
    local_b0 = (long)yMin;
    do {
      if (xMin < xMax) {
        lVar7 = (local_b0 - yMin) * (long)this;
        lVar17 = (long)xMin;
        do {
          lVar19 = lVar17 - xMin;
          *(undefined4 *)((long)px + lVar19 * 8 + lVar7 * 8) = 0;
          *(undefined2 *)((long)px + lVar19 * 8 + lVar7 * 8 + 4) = 0;
          lVar5 = _imath_half_to_float_table;
          if (xSamples < 1) {
            uVar9 = 0;
            uVar13 = 0;
            uVar8 = 0;
          }
          else {
            uVar9 = 0;
            dVar1 = 0.0;
            uVar12 = 0;
            uVar8 = 0;
            iVar15 = 0;
            do {
              if (0 < ySamples) {
                iVar11 = 0;
                dVar26 = 0.0;
                do {
                  uVar18 = 0;
                  dVar2 = rSeed;
                  dVar22 = iSeed;
                  do {
                    uVar6 = uVar18 + 1;
                    if (0xfe < uVar18) break;
                    dVar25 = dVar2 * dVar2 - dVar22 * dVar22;
                    dVar22 = (dVar2 + dVar2) * dVar22 +
                             (dVar26 * (double)(1.0 / (float)iVar16) + (double)(int)local_b0) *
                             ((((aspect * (rMax - rMin) * (double)h) / (double)w + iMin) - iMin) /
                             (double)h) + iMin;
                    dVar2 = (dVar1 * (double)(1.0 / (float)iVar10) + (double)(int)lVar17) *
                            ((rMax - rMin) / (double)w) + rMin + dVar25;
                    uVar18 = uVar6;
                  } while (dVar25 < 100.0);
                  fVar23 = (float)(int)uVar6 * 0.00390625;
                  if ((uint)fVar23 < 0x38800000) {
                    if ((uint)fVar23 < 0x33000001) {
                      uVar14 = 0;
                    }
                    else {
                      uVar18 = (uint)fVar23 & 0x7fffff | 0x800000;
                      cVar3 = (char)((uint)fVar23 >> 0x17);
                      uVar14 = (ushort)(uVar18 >> (0x7eU - cVar3 & 0x1f));
                      if (0x80000000 < uVar18 << (cVar3 + 0xa2U & 0x1f)) {
                        uVar14 = uVar14 + 1;
                      }
                    }
                  }
                  else if ((uint)fVar23 < 0x7f800000) {
                    if ((uint)fVar23 < 0x477ff000) {
                      uVar14 = (ushort)((int)fVar23 + 0x8000fff +
                                        (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd);
                    }
                    else {
                      uVar14 = 0x7c00;
                    }
                  }
                  else {
                    uVar14 = 0x7c00;
                    if (fVar23 != INFINITY) {
                      uVar18 = (uint)fVar23 >> 0xd & 0x3ff;
                      uVar14 = (ushort)(uVar18 == 0) | (ushort)uVar18 | 0x7c00;
                    }
                  }
                  *(ushort *)((long)px + lVar19 * 8 + lVar7 * 8 + 6) = uVar14;
                  fVar23 = fVar23 * 4.0;
                  fVar21 = (fVar23 - (float)(int)fVar23) + (fVar23 - (float)(int)fVar23);
                  fVar24 = (float)(~-(uint)(fVar21 < 1.0) & (uint)(2.0 - fVar21) |
                                  (uint)fVar21 & -(uint)(fVar21 < 1.0)) * 4.0 + 0.1 +
                           *(float *)(lVar5 + (uVar8 & 0xffff) * 4);
                  fVar21 = ABS(fVar24);
                  uVar18 = (uint)fVar24 >> 0x10 & 0x8000;
                  uVar8 = (ulong)uVar18;
                  if ((uint)fVar21 < 0x38800000) {
                    if (0x33000000 < (uint)fVar21) {
                      uVar6 = (uint)fVar21 & 0x7fffff | 0x800000;
                      cVar3 = (char)((uint)fVar21 >> 0x17);
                      uVar18 = uVar18 | uVar6 >> (0x7eU - cVar3 & 0x1f);
                      uVar8 = (ulong)uVar18;
                      if (0x80000000 < uVar6 << (cVar3 + 0xa2U & 0x1f)) {
                        uVar8 = (ulong)(uVar18 + 1);
                      }
                    }
                  }
                  else if ((uint)fVar21 < 0x7f800000) {
                    if ((uint)fVar21 < 0x477ff000) {
                      uVar8 = (ulong)((int)fVar21 + 0x8000fff +
                                      (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd | uVar18);
                    }
                    else {
                      uVar8 = (ulong)(uVar18 | 0x7c00);
                    }
                  }
                  else {
                    uVar8 = (ulong)(uVar18 | 0x7c00);
                    if (fVar21 != INFINITY) {
                      uVar6 = (uint)fVar21 >> 0xd & 0x3ff;
                      uVar8 = (ulong)(uVar18 | 0x7c00 | uVar6 | (uint)(uVar6 == 0));
                    }
                  }
                  *(short *)((long)px + lVar19 * 8 + lVar7 * 8) = (short)uVar8;
                  fVar21 = (fVar23 + 0.33333) - (float)(int)(fVar23 + 0.33333);
                  fVar21 = fVar21 + fVar21;
                  fVar24 = (float)(~-(uint)(fVar21 < 1.0) & (uint)(2.0 - fVar21) |
                                  (uint)fVar21 & -(uint)(fVar21 < 1.0)) * 4.0 + 0.1 +
                           *(float *)(lVar5 + (ulong)(uVar12 & 0xffff) * 4);
                  fVar21 = ABS(fVar24);
                  uVar12 = (uint)fVar24 >> 0x10 & 0x8000;
                  if ((uint)fVar21 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar21) &&
                       (uVar18 = (uint)fVar21 & 0x7fffff | 0x800000,
                       cVar3 = (char)((uint)fVar21 >> 0x17),
                       uVar12 = uVar12 | uVar18 >> (0x7eU - cVar3 & 0x1f),
                       0x80000000 < uVar18 << (cVar3 + 0xa2U & 0x1f))) {
                      uVar12 = uVar12 + 1;
                    }
                  }
                  else if ((uint)fVar21 < 0x7f800000) {
                    if ((uint)fVar21 < 0x477ff000) {
                      uVar12 = (int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >>
                               0xd | uVar12;
                    }
                    else {
                      uVar12 = uVar12 | 0x7c00;
                    }
                  }
                  else {
                    uVar12 = uVar12 | 0x7c00;
                    if (fVar21 != INFINITY) {
                      uVar18 = (uint)fVar21 >> 0xd & 0x3ff;
                      uVar12 = uVar12 | uVar18 | (uint)(uVar18 == 0);
                    }
                  }
                  *(short *)((long)px + lVar19 * 8 + lVar7 * 8 + 2) = (short)uVar12;
                  fVar23 = (fVar23 + 0.66667) - (float)(int)(fVar23 + 0.66667);
                  fVar23 = fVar23 + fVar23;
                  fVar21 = (float)(~-(uint)(fVar23 < 1.0) & (uint)(2.0 - fVar23) |
                                  (uint)fVar23 & -(uint)(fVar23 < 1.0)) * 4.0 + 0.1 +
                           *(float *)(lVar5 + (uVar9 & 0xffff) * 4);
                  fVar23 = ABS(fVar21);
                  uVar18 = (uint)fVar21 >> 0x10 & 0x8000;
                  uVar9 = (ulong)uVar18;
                  if ((uint)fVar23 < 0x38800000) {
                    if (0x33000000 < (uint)fVar23) {
                      uVar6 = (uint)fVar23 & 0x7fffff | 0x800000;
                      cVar3 = (char)((uint)fVar23 >> 0x17);
                      uVar18 = uVar18 | uVar6 >> (0x7eU - cVar3 & 0x1f);
                      uVar9 = (ulong)uVar18;
                      if (0x80000000 < uVar6 << (cVar3 + 0xa2U & 0x1f)) {
                        uVar9 = (ulong)(uVar18 + 1);
                      }
                    }
                  }
                  else if ((uint)fVar23 < 0x7f800000) {
                    if ((uint)fVar23 < 0x477ff000) {
                      uVar9 = (ulong)((int)fVar23 + 0x8000fff +
                                      (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd | uVar18);
                    }
                    else {
                      uVar9 = (ulong)(uVar18 | 0x7c00);
                    }
                  }
                  else {
                    uVar9 = (ulong)(uVar18 | 0x7c00);
                    if (fVar23 != INFINITY) {
                      uVar6 = (uint)fVar23 >> 0xd & 0x3ff;
                      uVar9 = (ulong)(uVar18 | 0x7c00 | uVar6 | (uint)(uVar6 == 0));
                    }
                  }
                  *(short *)((long)px + lVar19 * 8 + lVar7 * 8 + 4) = (short)uVar9;
                  dVar26 = dVar26 + 1.0;
                  iVar11 = iVar11 + 1;
                } while (iVar11 != iVar16);
              }
              dVar1 = dVar1 + 1.0;
              iVar15 = iVar15 + 1;
            } while (iVar15 != iVar10);
            uVar8 = uVar8 & 0xffff;
            uVar13 = (ulong)(uVar12 & 0xffff);
            uVar9 = uVar9 & 0xffff;
          }
          fVar21 = *(float *)(lVar4 + uVar8 * 4) * fVar20;
          fVar23 = ABS(fVar21);
          uVar14 = (ushort)((uint)fVar21 >> 0x10) & 0x8000;
          if ((uint)fVar23 < 0x38800000) {
            if ((0x33000000 < (uint)fVar23) &&
               (uVar12 = (uint)fVar23 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar23 >> 0x17),
               uVar14 = uVar14 | (ushort)(uVar12 >> (0x7eU - cVar3 & 0x1f)),
               0x80000000 < uVar12 << (cVar3 + 0xa2U & 0x1f))) {
              uVar14 = uVar14 + 1;
            }
          }
          else if ((uint)fVar23 < 0x7f800000) {
            if ((uint)fVar23 < 0x477ff000) {
              uVar14 = (ushort)((int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >>
                               0xd) | uVar14;
            }
            else {
              uVar14 = uVar14 | 0x7c00;
            }
          }
          else {
            uVar14 = uVar14 | 0x7c00;
            if (fVar23 != INFINITY) {
              uVar12 = (uint)fVar23 >> 0xd & 0x3ff;
              uVar14 = uVar14 | (ushort)uVar12 | (ushort)(uVar12 == 0);
            }
          }
          *(ushort *)((long)px + lVar19 * 8 + lVar7 * 8) = uVar14;
          fVar21 = *(float *)(lVar4 + uVar13 * 4) * fVar20;
          fVar23 = ABS(fVar21);
          uVar14 = (ushort)((uint)fVar21 >> 0x10) & 0x8000;
          if ((uint)fVar23 < 0x38800000) {
            if ((0x33000000 < (uint)fVar23) &&
               (uVar12 = (uint)fVar23 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar23 >> 0x17),
               uVar14 = uVar14 | (ushort)(uVar12 >> (0x7eU - cVar3 & 0x1f)),
               0x80000000 < uVar12 << (cVar3 + 0xa2U & 0x1f))) {
              uVar14 = uVar14 + 1;
            }
          }
          else if ((uint)fVar23 < 0x7f800000) {
            if ((uint)fVar23 < 0x477ff000) {
              uVar14 = (ushort)((int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >>
                               0xd) | uVar14;
            }
            else {
              uVar14 = uVar14 | 0x7c00;
            }
          }
          else {
            uVar14 = uVar14 | 0x7c00;
            if (fVar23 != INFINITY) {
              uVar12 = (uint)fVar23 >> 0xd & 0x3ff;
              uVar14 = uVar14 | (ushort)uVar12 | (ushort)(uVar12 == 0);
            }
          }
          *(ushort *)((long)px + lVar19 * 8 + lVar7 * 8 + 2) = uVar14;
          fVar21 = *(float *)(lVar4 + uVar9 * 4) * fVar20;
          fVar23 = ABS(fVar21);
          uVar14 = (ushort)((uint)fVar21 >> 0x10) & 0x8000;
          if ((uint)fVar23 < 0x38800000) {
            if ((0x33000000 < (uint)fVar23) &&
               (uVar12 = (uint)fVar23 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar23 >> 0x17),
               uVar14 = uVar14 | (ushort)(uVar12 >> (0x7eU - cVar3 & 0x1f)),
               0x80000000 < uVar12 << (cVar3 + 0xa2U & 0x1f))) {
              uVar14 = uVar14 + 1;
            }
          }
          else if ((uint)fVar23 < 0x7f800000) {
            if ((uint)fVar23 < 0x477ff000) {
              uVar14 = (ushort)((int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >>
                               0xd) | uVar14;
            }
            else {
              uVar14 = uVar14 | 0x7c00;
            }
          }
          else {
            uVar14 = uVar14 | 0x7c00;
            if (fVar23 != INFINITY) {
              uVar12 = (uint)fVar23 >> 0xd & 0x3ff;
              uVar14 = uVar14 | (ushort)uVar12 | (ushort)(uVar12 == 0);
            }
          }
          *(ushort *)((long)px + lVar19 * 8 + lVar7 * 8 + 4) = uVar14;
          fVar21 = *(float *)(lVar4 + (ulong)*(ushort *)((long)px + lVar19 * 8 + lVar7 * 8 + 6) * 4)
                   * fVar20;
          fVar23 = ABS(fVar21);
          uVar14 = (ushort)((uint)fVar21 >> 0x10) & 0x8000;
          if ((uint)fVar23 < 0x38800000) {
            if ((0x33000000 < (uint)fVar23) &&
               (uVar12 = (uint)fVar23 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar23 >> 0x17),
               uVar14 = uVar14 | (ushort)(uVar12 >> (0x7eU - cVar3 & 0x1f)),
               0x80000000 < uVar12 << (cVar3 + 0xa2U & 0x1f))) {
              uVar14 = uVar14 + 1;
            }
          }
          else if ((uint)fVar23 < 0x7f800000) {
            if ((uint)fVar23 < 0x477ff000) {
              uVar14 = (ushort)((int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >>
                               0xd) | uVar14;
            }
            else {
              uVar14 = uVar14 | 0x7c00;
            }
          }
          else {
            uVar14 = uVar14 | 0x7c00;
            if (fVar23 != INFINITY) {
              uVar12 = (uint)fVar23 >> 0xd & 0x3ff;
              uVar14 = uVar14 | (ushort)uVar12 | (ushort)(uVar12 == 0);
            }
          }
          *(ushort *)((long)px + lVar19 * 8 + lVar7 * 8 + 6) = uVar14;
          lVar17 = lVar17 + 1;
        } while (lVar17 != xMax);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != yMax);
  }
  return;
}

Assistant:

void
mndl (
    Array2D<P>& px,
    int         w,
    int         h,
    int         xMin,
    int         xMax,
    int         yMin,
    int         yMax,
    int         xSamples,
    int         ySamples,
    double      rMin,
    double      rMax,
    double      iMin,
    double      aspect,
    double      rSeed,
    double      iSeed)
{
    if (xSamples > 6) xSamples = 6;

    if (ySamples > 6) ySamples = 6;

    double iMax = iMin + aspect * (rMax - rMin) * h / w;
    double sx   = double (rMax - rMin) / w;
    double sy   = double (iMax - iMin) / h;
    double tx   = 1.f / xSamples;
    double ty   = 1.f / ySamples;
    float  t    = tx * ty;

    for (int y = yMin; y < yMax; ++y)
    {
        for (int x = xMin; x < xMax; ++x)
        {
            P& p = px[y - yMin][x - xMin];

            clear (p);

            for (int i = 0; i < xSamples; ++i)
            {
                for (int j = 0; j < ySamples; ++j)
                {
                    const double a    = rMin + sx * (x + i * tx);
                    const double b    = iMin + sy * (y + j * ty);
                    const double sMax = 100;
                    const int    kMax = 256;
                    double       r    = rSeed;
                    double       i    = iSeed;
                    double       s    = 0;
                    int          k    = 0;

                    while (k < kMax && s < sMax)
                    {
                        s = r * r - i * i;
                        i = 2 * r * i + b;
                        r = s + a;
                        k++;
                    }

                    add (k / float (kMax), p);
                }
            }

            scale (t, p);
        }
    }
}